

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O2

void __thiscall amrex::BoxArray::BoxArray(BoxArray *this,BoxArray *rhs,BATransformer *trans)

{
  long lVar1;
  BATransformer *pBVar2;
  BoxArray *pBVar3;
  IntVect IVar4;
  IntVect IVar5;
  IntVect local_30;
  
  pBVar2 = trans;
  pBVar3 = this;
  for (lVar1 = 0x12; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pBVar3->m_bat).m_bat_type = pBVar2->m_bat_type;
    pBVar2 = (BATransformer *)&pBVar2->m_op;
    pBVar3 = (BoxArray *)&(pBVar3->m_bat).m_op;
  }
  std::__shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>,
             &(rhs->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>);
  (this->m_simplified_list).super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_simplified_list).super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  IVar4 = BATransformer::coarsen_ratio(&rhs->m_bat);
  IVar5 = BATransformer::coarsen_ratio(trans);
  local_30.vect[2] = IVar5.vect[2] * IVar4.vect[2];
  local_30.vect._0_8_ =
       (ulong)(uint)(IVar5.vect[0] * IVar4.vect[0]) |
       (IVar5.vect._0_8_ >> 0x20) * (IVar4.vect._0_8_ & 0xffffffff00000000);
  BATransformer::set_coarsen_ratio(&this->m_bat,&local_30);
  return;
}

Assistant:

BoxArray::BoxArray (const BoxArray& rhs, const BATransformer& trans)
    :
    m_bat(trans),
    m_ref(rhs.m_ref)
{
    BL_ASSERT(rhs.ixType().cellCentered());  // rhs must be cell-centered.
    m_bat.set_coarsen_ratio(rhs.crseRatio() * trans.coarsen_ratio());
}